

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3FkRequired(Parse *pParse,Table *pTab,int *aChange,int chngRowid)

{
  byte bVar1;
  char *pcVar2;
  int iVar3;
  FKey *pFVar4;
  HashElem *pHVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  
  if ((((uint)pParse >> 0xe & 1) != 0) && (pTab->eTabType == '\0')) {
    if (aChange == (int *)0x0) {
      pHVar5 = findElementWithHash(&pTab->pSchema->fkeyHash,pTab->zName,(uint *)0x0);
      iVar6 = 1;
      if (pHVar5->data != (void *)0x0) {
        return 1;
      }
      bVar8 = (pTab->u).tab.pFKey != (FKey *)0x0;
    }
    else {
      pFVar4 = (pTab->u).tab.pFKey;
      if (pFVar4 != (FKey *)0x0) {
        iVar6 = 1;
        bVar8 = false;
LAB_001abcd2:
        if (0 < (long)pFVar4->nCol) {
          lVar7 = 0;
          do {
            iVar3 = *(int *)((long)&pFVar4->aCol[0].iFrom + lVar7);
            if ((-1 < aChange[iVar3]) || ((chngRowid != 0 && (iVar3 == pTab->iPKey)))) {
              pcVar2 = pFVar4->zTo;
              bVar8 = true;
              if (pTab->zName == (char *)0x0) {
                if (pcVar2 == (char *)0x0) goto LAB_001abd4a;
              }
              else if (pcVar2 != (char *)0x0) {
                lVar7 = 0;
                goto LAB_001abd20;
              }
              break;
            }
            lVar7 = lVar7 + 0x10;
          } while ((long)pFVar4->nCol * 0x10 != lVar7);
        }
        goto LAB_001abd55;
      }
      bVar8 = false;
      iVar6 = 1;
LAB_001abda8:
      pHVar5 = findElementWithHash(&pTab->pSchema->fkeyHash,pTab->zName,(uint *)0x0);
      for (pFVar4 = (FKey *)pHVar5->data; pFVar4 != (FKey *)0x0; pFVar4 = pFVar4->pNextTo) {
        iVar3 = fkParentIsModified(pTab,pFVar4,aChange,chngRowid);
        if ((iVar3 != 0) && (bVar8 = true, pFVar4->aAction[1] != '\0')) {
          return 2;
        }
      }
    }
    if (bVar8) {
      return iVar6;
    }
  }
  return 0;
LAB_001abd20:
  bVar1 = pTab->zName[lVar7];
  if (bVar1 == pcVar2[lVar7]) {
    if ((ulong)bVar1 == 0) goto LAB_001abd4a;
  }
  else if (""[bVar1] != ""[(byte)pcVar2[lVar7]]) goto LAB_001abd55;
  lVar7 = lVar7 + 1;
  goto LAB_001abd20;
LAB_001abd4a:
  bVar8 = true;
  iVar6 = 2;
LAB_001abd55:
  pFVar4 = pFVar4->pNextFrom;
  if (pFVar4 == (FKey *)0x0) goto LAB_001abda8;
  goto LAB_001abcd2;
}

Assistant:

SQLITE_PRIVATE int sqlite3FkRequired(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being modified */
  int *aChange,                   /* Non-NULL for UPDATE operations */
  int chngRowid                   /* True for UPDATE that affects rowid */
){
  int eRet = 1;                   /* Value to return if bHaveFK is true */
  int bHaveFK = 0;                /* If FK processing is required */
  if( pParse->db->flags&SQLITE_ForeignKeys && IsOrdinaryTable(pTab) ){
    if( !aChange ){
      /* A DELETE operation. Foreign key processing is required if the
      ** table in question is either the child or parent table for any
      ** foreign key constraint.  */
      bHaveFK = (sqlite3FkReferences(pTab) || pTab->u.tab.pFKey);
    }else{
      /* This is an UPDATE. Foreign key processing is only required if the
      ** operation modifies one or more child or parent key columns. */
      FKey *p;

      /* Check if any child key columns are being modified. */
      for(p=pTab->u.tab.pFKey; p; p=p->pNextFrom){
        if( fkChildIsModified(pTab, p, aChange, chngRowid) ){
          if( 0==sqlite3_stricmp(pTab->zName, p->zTo) ) eRet = 2;
          bHaveFK = 1;
        }
      }

      /* Check if any parent key columns are being modified. */
      for(p=sqlite3FkReferences(pTab); p; p=p->pNextTo){
        if( fkParentIsModified(pTab, p, aChange, chngRowid) ){
          if( p->aAction[1]!=OE_None ) return 2;
          bHaveFK = 1;
        }
      }
    }
  }
  return bHaveFK ? eRet : 0;
}